

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table_iterators.h
# Opt level: O1

void __thiscall
draco::VertexRingIterator<draco::MeshAttributeCornerTable>::Next
          (VertexRingIterator<draco::MeshAttributeCornerTable> *this)

{
  uint uVar1;
  MeshAttributeCornerTable *pMVar2;
  ulong uVar3;
  uint uVar4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar5;
  
  pMVar2 = this->corner_table_;
  uVar4 = (this->corner_).value_;
  uVar3 = (ulong)uVar4;
  if (this->left_traversal_ == true) {
    if (uVar4 != 0xffffffff) {
      uVar3 = (ulong)(uVar4 - 2);
      if (0x55555555 < (uVar4 + 1) * -0x55555555) {
        uVar3 = (ulong)(uVar4 + 1);
      }
    }
    IVar5.value_ = 0xffffffff;
    if (((int)uVar3 != -1) &&
       ((*(ulong *)(*(long *)&(pMVar2->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                   (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0)) {
      IVar5.value_ = (pMVar2->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
    }
    uVar4 = IVar5.value_;
    if (IVar5.value_ != 0xffffffff) {
      uVar4 = IVar5.value_ - 2;
      if (0x55555555 < (IVar5.value_ + 1) * -0x55555555) {
        uVar4 = IVar5.value_ + 1;
      }
    }
    (this->corner_).value_ = uVar4;
    uVar1 = (this->start_corner_).value_;
    if (uVar4 == 0xffffffff) {
      (this->corner_).value_ = uVar1;
      this->left_traversal_ = false;
      return;
    }
    if (uVar4 == uVar1) {
      (this->corner_).value_ = 0xffffffff;
      return;
    }
  }
  else {
    if (uVar4 != 0xffffffff) {
      uVar3 = (ulong)(((uVar4 * -0x55555555 < 0x55555556) - 1 | 2) + uVar4);
    }
    IVar5.value_ = 0xffffffff;
    if (((int)uVar3 != -1) &&
       ((*(ulong *)(*(long *)&(pMVar2->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                   (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0)) {
      IVar5.value_ = (pMVar2->corner_table_->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar3].value_;
    }
    if (IVar5.value_ != 0xffffffff) {
      IVar5.value_ = IVar5.value_ + ((IVar5.value_ * -0x55555555 < 0x55555556) - 1 | 2);
    }
    (this->corner_).value_ = IVar5.value_;
  }
  return;
}

Assistant:

void Next() {
    if (left_traversal_) {
      corner_ = corner_table_->SwingLeft(corner_);
      if (corner_ == kInvalidCornerIndex) {
        // Open boundary reached.
        corner_ = start_corner_;
        left_traversal_ = false;
      } else if (corner_ == start_corner_) {
        // End reached.
        corner_ = kInvalidCornerIndex;
      }
    } else {
      // Go to the right until we reach a boundary there (no explicit check
      // is needed in this case).
      corner_ = corner_table_->SwingRight(corner_);
    }
  }